

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O2

void __thiscall bsplib::Unbuf::start(Unbuf *this)

{
  pointer pEVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  size_t i_1;
  long lVar7;
  
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::resize
            (&this->m_reqs,
             ((long)(this->m_recvs).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_recvs).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5) +
             ((long)(this->m_sends).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_sends).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5));
  lVar7 = 0;
  uVar5 = 0;
  while( true ) {
    pEVar1 = (this->m_recvs).
             super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_recvs).
                      super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 5) <= uVar5)
    break;
    uVar2 = *(ulong *)((long)&pEVar1->size + lVar7 * 4);
    uVar4 = this->m_max_msg_size;
    if (uVar2 < this->m_max_msg_size) {
      uVar4 = uVar2;
    }
    lVar6 = *(long *)((long)&pEVar1->addr + lVar7 * 4);
    *(ulong *)((long)&pEVar1->addr + lVar7 * 4) = lVar6 + uVar4;
    *(ulong *)((long)&pEVar1->size + lVar7 * 4) = uVar2 - uVar4;
    MPI_Irecv(lVar6,uVar4,&ompi_mpi_byte,(&pEVar1->pid)[lVar7],(&pEVar1->tag)[lVar7],this->m_comm,
              (long)(this->m_reqs).
                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar7);
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 8;
  }
  MPI_Barrier(this->m_comm);
  lVar6 = 0x18;
  for (uVar5 = 0;
      pEVar1 = (this->m_sends).
               super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->m_sends).
                            super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 5);
      uVar5 = uVar5 + 1) {
    uVar2 = *(ulong *)((long)pEVar1 + lVar6 + -8);
    uVar4 = this->m_max_msg_size;
    if (uVar2 < this->m_max_msg_size) {
      uVar4 = uVar2;
    }
    lVar3 = *(long *)((long)pEVar1 + lVar6 + -0x10);
    *(ulong *)((long)pEVar1 + lVar6 + -0x10) = lVar3 + uVar4;
    *(ulong *)((long)pEVar1 + lVar6 + -8) = uVar2 - uVar4;
    MPI_Irsend(lVar3,uVar4,&ompi_mpi_byte,*(undefined4 *)((long)pEVar1 + lVar6 + -0x18),
               *(undefined4 *)((long)&pEVar1->pid + lVar6),this->m_comm,
               (long)(this->m_reqs).
                     super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
                     .super__Vector_impl_data._M_start + lVar7);
    lVar6 = lVar6 + 0x20;
    lVar7 = lVar7 + 8;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->m_ready,
             (long)(this->m_reqs).
                   super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_reqs).
                   super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

void Unbuf :: start( )
{
   m_reqs.resize( m_sends.size() + m_recvs.size() );
   size_t j = 0;
   for ( size_t i = 0 ; i < m_recvs.size(); ++j, ++i ) {
       Entry & u = m_recvs[i];
       size_t size = std::min( m_max_msg_size, u.size );
       char * addr = const_cast<char *>( u.addr );
       char * next_addr = addr + size;
       u.addr = next_addr;
       u.size -= size;
       const int tag = u.tag;
       MPI_Irecv( addr, int(size), MPI_BYTE, u.pid, tag, m_comm, &m_reqs[j]);
   }

   MPI_Barrier( m_comm ); // so we can use ready sends

   for ( size_t i = 0 ; i < m_sends.size(); ++j, ++i ) {
       Entry & u = m_sends[i];
       size_t size = std::min( m_max_msg_size, u.size );
       char * addr = const_cast<char *>( u.addr );
       char * next_addr = addr + size;
       u.addr = next_addr;
       u.size -= size;
       const int tag = u.tag;
       MPI_Irsend( addr, int(size), MPI_BYTE, u.pid, tag, m_comm, &m_reqs[j]);
   }

   m_ready.resize( m_reqs.size() );
}